

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O2

string * __thiscall
re2::ProgToString_abi_cxx11_(string *__return_storage_ptr__,re2 *this,Prog *prog,Workq *q)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  uint *puVar4;
  Inst *this_00;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  puVar3 = *(uint **)&prog->size_;
  for (puVar4 = puVar3; iVar2._0_1_ = prog->anchor_start_, iVar2._1_1_ = prog->anchor_end_,
      iVar2._2_1_ = prog->reversed_, iVar2._3_1_ = prog->did_flatten_, puVar4 != puVar3 + iVar2;
      puVar4 = puVar4 + 1) {
    uVar1 = *puVar4;
    this_00 = (Inst *)((long)(int)uVar1 * 8 + *(long *)(this + 0x48));
    Prog::Inst::Dump_abi_cxx11_(&local_50,this_00);
    StringAppendF(__return_storage_ptr__,"%d. %s\n",(ulong)uVar1,local_50._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_50);
    AddToQueue((Workq *)prog,this_00->out_opcode_ >> 4);
    if ((this_00->out_opcode_ & 6) == 0) {
      iVar2 = Prog::Inst::out1(this_00);
      AddToQueue((Workq *)prog,iVar2);
    }
    puVar3 = *(uint **)&prog->size_;
  }
  return __return_storage_ptr__;
}

Assistant:

static string ProgToString(Prog* prog, Workq* q) {
  string s;
  for (Workq::iterator i = q->begin(); i != q->end(); ++i) {
    int id = *i;
    Prog::Inst* ip = prog->inst(id);
    StringAppendF(&s, "%d. %s\n", id, ip->Dump().c_str());
    AddToQueue(q, ip->out());
    if (ip->opcode() == kInstAlt || ip->opcode() == kInstAltMatch)
      AddToQueue(q, ip->out1());
  }
  return s;
}